

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestGroup::~TestGroup(TestGroup *this)

{
  TestGroup *this_local;
  
  ~TestGroup(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TestGroup::~TestGroup() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestGroup)
  SharedDtor(*this);
}